

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASValue.cpp
# Opt level: O0

vector<ASValue_*,_std::allocator<ASValue_*>_> * __thiscall
ASValue::getOperandsWithOp2
          (vector<ASValue_*,_std::allocator<ASValue_*>_> *__return_storage_ptr__,ASValue *this)

{
  bool bVar1;
  reference ppAVar2;
  ASValue *pAVar3;
  ASOperand2 *local_b0;
  ASOperand2 *local_88;
  ASValue *local_80;
  ASValue *local_78;
  ASOperand2 *local_70;
  ASOperand2 *op2;
  ASValue *i;
  iterator __end1;
  iterator __begin1;
  vector<ASValue_*,_std::allocator<ASValue_*>_> local_40;
  vector<ASValue_*,_std::allocator<ASValue_*>_> *local_28;
  vector<ASValue_*,_std::allocator<ASValue_*>_> *__range1;
  ASValue *local_18;
  ASValue *this_local;
  vector<ASValue_*,_std::allocator<ASValue_*>_> *val;
  
  __range1._7_1_ = 0;
  local_18 = this;
  this_local = (ASValue *)__return_storage_ptr__;
  std::vector<ASValue_*,_std::allocator<ASValue_*>_>::vector(__return_storage_ptr__);
  getOperands(&local_40,this);
  local_28 = &local_40;
  __end1 = std::vector<ASValue_*,_std::allocator<ASValue_*>_>::begin(local_28);
  i = (ASValue *)std::vector<ASValue_*,_std::allocator<ASValue_*>_>::end(local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<ASValue_**,_std::vector<ASValue_*,_std::allocator<ASValue_*>_>_>
                                     *)&i), bVar1) {
    ppAVar2 = __gnu_cxx::
              __normal_iterator<ASValue_**,_std::vector<ASValue_*,_std::allocator<ASValue_*>_>_>::
              operator*(&__end1);
    op2 = (ASOperand2 *)*ppAVar2;
    if (op2 == (ASOperand2 *)0x0) {
      local_b0 = (ASOperand2 *)0x0;
    }
    else {
      local_b0 = (ASOperand2 *)__dynamic_cast(op2,&typeinfo,&ASOperand2::typeinfo,0);
    }
    local_70 = local_b0;
    if (local_b0 == (ASOperand2 *)0x0) {
      local_88 = local_b0;
      std::vector<ASValue_*,_std::allocator<ASValue_*>_>::push_back
                (__return_storage_ptr__,(value_type *)&local_88);
    }
    else {
      pAVar3 = ASOperand2::getRm(local_b0);
      if (pAVar3 != (ASValue *)0x0) {
        local_78 = ASOperand2::getRm(local_70);
        std::vector<ASValue_*,_std::allocator<ASValue_*>_>::push_back
                  (__return_storage_ptr__,&local_78);
      }
      pAVar3 = ASOperand2::getRs(local_70);
      if (pAVar3 != (ASValue *)0x0) {
        local_80 = ASOperand2::getRs(local_70);
        std::vector<ASValue_*,_std::allocator<ASValue_*>_>::push_back
                  (__return_storage_ptr__,&local_80);
      }
    }
    __gnu_cxx::__normal_iterator<ASValue_**,_std::vector<ASValue_*,_std::allocator<ASValue_*>_>_>::
    operator++(&__end1);
  }
  std::vector<ASValue_*,_std::allocator<ASValue_*>_>::~vector(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<ASValue *> ASValue::getOperandsWithOp2() {
    std::vector<ASValue *> val;
    for (auto i : getOperands()) {
        if (auto op2 = dynamic_cast<ASOperand2 *>(i)) {
            if (op2->getRm()) {
                val.push_back(op2->getRm());
            }
            if (op2->getRs()) {
                val.push_back(op2->getRs());
            }
        } else {
            val.push_back(op2);
        }
    }
    return val;
}